

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O1

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addArgumentsOperands
          (LLVMPointerGraphBuilder *this,Function *F,CallInst *CI,uint index)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  __hash_code __code;
  ulong uVar5;
  
  if (((byte)F[0x12] & 1) != 0) {
    llvm::Function::BuildLazyArguments();
  }
  uVar5 = *(ulong *)(F + 0x58);
  if (((byte)F[0x12] & 1) != 0) {
    llvm::Function::BuildLazyArguments();
  }
  lVar1 = *(long *)(F + 0x60);
  lVar2 = *(long *)(F + 0x58);
  for (; uVar5 != lVar1 * 0x28 + lVar2; uVar5 = uVar5 + 0x28) {
    plVar3 = *(long **)(*(long *)(this + 0x188) + (uVar5 % *(ulong *)(this + 400)) * 8);
    for (plVar4 = (long *)*plVar3; uVar5 != plVar4[1]; plVar4 = (long *)*plVar4) {
      plVar3 = plVar4;
    }
    if (CI == (CallInst *)0x0) {
      addArgumentOperands(this,F,(PSNode *)**(undefined8 **)(*plVar3 + 0x10),index);
    }
    else {
      addArgumentOperands(this,CI,(PSNode *)**(undefined8 **)(*plVar3 + 0x10),index);
    }
    index = index + 1;
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addArgumentsOperands(const llvm::Function *F,
                                                   const llvm::CallInst *CI,
                                                   unsigned index) {
    for (auto A = F->arg_begin(), E = F->arg_end(); A != E; ++A, ++index) {
        auto it = nodes_map.find(&*A);
        assert(it != nodes_map.end());
        PSNodesSeq &cur = it->second;

        if (CI) {
            // with func ptr call we know from which
            // call we should take the values
            addArgumentOperands(CI, cur.getSingleNode(), index);
        } else {
            // with regular call just use all calls
            addArgumentOperands(F, cur.getSingleNode(), index);
        }
    }
}